

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetBuildCommand
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf,
          string *targetName)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  ostream *poVar4;
  string local_260 [32];
  undefined1 local_240 [8];
  ostringstream ss;
  allocator local_c2;
  allocator local_c1;
  string local_c0;
  string local_a0 [8];
  string make;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string generator;
  string *targetName_local;
  cmMakefile *mf_local;
  cmExtraCodeLiteGenerator *this_local;
  string *buildCommand;
  
  generator.field_2._8_8_ = targetName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_GENERATOR",&local_69);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_48,pcVar2,(allocator *)(make.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(make.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"CMAKE_MAKE_PROGRAM",&local_c1);
  pcVar2 = cmMakefile::GetRequiredDefinition(mf,&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar2,&local_c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_a0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"NMake Makefiles");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"Ninja"), bVar1)) {
    std::operator<<((ostream *)local_240,local_a0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"MinGW Makefiles");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"Unix Makefiles"), bVar1)) {
      poVar4 = std::operator<<((ostream *)local_240,local_a0);
      poVar4 = std::operator<<(poVar4," -j ");
      std::ostream::operator<<(poVar4,this->CpuCount);
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_240," ");
    std::operator<<(poVar4,(string *)generator.field_2._8_8_);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_260);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetBuildCommand(
  const cmMakefile* mf, const std::string& targetName) const
{
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string buildCommand = make; // Default
  std::ostringstream ss;
  if (generator == "NMake Makefiles" || generator == "Ninja") {
    ss << make;
  } else if (generator == "MinGW Makefiles" || generator == "Unix Makefiles") {
    ss << make << " -j " << this->CpuCount;
  }
  if (!targetName.empty()) {
    ss << " " << targetName;
  }
  buildCommand = ss.str();
  return buildCommand;
}